

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O1

int ddVarGroupCheck(DdManager *table,int x,int y)

{
  uint index;
  uint index_00;
  int iVar1;
  uint uVar2;
  
  index = table->invperm[x];
  index_00 = table->invperm[y];
  iVar1 = Cudd_bddIsVarToBeUngrouped(table,index);
  if (iVar1 != 0) {
    return 0;
  }
  uVar2 = Cudd_bddReadPairIndex(table,index);
  if (((uVar2 == index_00) &&
      (((((int)index < 0 || table->size <= (int)index ||
         (table->subtables[table->perm[index]].varHandled != 0)) ||
        ((int)index_00 < 0 || table->size <= (int)index_00)) ||
       (table->subtables[table->perm[index_00]].varHandled != 0)))) &&
     (((iVar1 = Cudd_bddIsVarToBeGrouped(table,index), iVar1 != 0 ||
       (iVar1 = Cudd_bddIsVarToBeGrouped(table,index_00), iVar1 != 0)) &&
      (table->keys - table->isolated <= originalSize)))) {
    return 1;
  }
  return 0;
}

Assistant:

static int
ddVarGroupCheck(
  DdManager * table,
  int x,
  int y)
{
    int xindex = table->invperm[x];
    int yindex = table->invperm[y];

    if (Cudd_bddIsVarToBeUngrouped(table, xindex)) return(0);

    if (Cudd_bddReadPairIndex(table, xindex) == yindex) {
        if (ddIsVarHandled(table, xindex) ||
            ddIsVarHandled(table, yindex)) {
            if (Cudd_bddIsVarToBeGrouped(table, xindex) ||
                Cudd_bddIsVarToBeGrouped(table, yindex) ) {
                if (table->keys - table->isolated <= originalSize) {
                    return(1);
                }
            }
        }
    }

    return(0);

}